

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_distance.cpp
# Opt level: O0

size_type pstore::command_line::string_distance(string *from,string *to,size_type max_edit_distance)

{
  char cVar1;
  initializer_list<unsigned_long> __l;
  size_type sVar2;
  size_t n_00;
  unsigned_long *puVar3;
  char *pcVar4;
  unsigned_long uVar5;
  unsigned_long local_2d8;
  long local_2d0;
  long local_2c8;
  iterator local_2c0;
  undefined8 local_2b8;
  unsigned_long local_2b0;
  unsigned_long old_diagonal;
  size_type y;
  size_type last_diagonal;
  size_type best_this_column;
  size_type x;
  size_type column_start;
  pointer_based_iterator<unsigned_long> local_268;
  undefined1 local_260 [8];
  small_vector<unsigned_long,_64UL> column;
  size_type n;
  size_type m;
  size_type max_edit_distance_local;
  string *to_local;
  string *from_local;
  
  n_00 = std::__cxx11::string::size();
  column.buffer_ = (unsigned_long *)std::__cxx11::string::size();
  small_vector<unsigned_long,_64UL>::small_vector
            ((small_vector<unsigned_long,_64UL> *)local_260,n_00 + 1);
  local_268.pos_ =
       (pointer)std::begin<pstore::small_vector<unsigned_long,64ul>>
                          ((small_vector<unsigned_long,_64UL> *)local_260);
  column_start = (size_type)
                 std::end<pstore::small_vector<unsigned_long,64ul>>
                           ((small_vector<unsigned_long,_64UL> *)local_260);
  std::iota<pstore::pointer_based_iterator<unsigned_long>,unsigned_long>
            (local_268,(pointer_based_iterator<unsigned_long>)column_start,0);
  x = 1;
  best_this_column = 1;
  do {
    sVar2 = best_this_column;
    if (column.buffer_ < best_this_column) {
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,n_00);
      from_local = (string *)*puVar3;
LAB_0013de0e:
      small_vector<unsigned_long,_64UL>::~small_vector
                ((small_vector<unsigned_long,_64UL> *)local_260);
      return (size_type)from_local;
    }
    puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                       ((small_vector<unsigned_long,_64UL> *)local_260,0);
    *puVar3 = sVar2;
    last_diagonal = best_this_column;
    y = best_this_column - 1;
    for (old_diagonal = 1; old_diagonal <= n_00; old_diagonal = old_diagonal + 1) {
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,old_diagonal);
      local_2b0 = *puVar3;
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,old_diagonal);
      local_2d8 = *puVar3 + 1;
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,old_diagonal - 1);
      sVar2 = y;
      local_2d0 = *puVar3 + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)from);
      cVar1 = *pcVar4;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)to);
      local_2c8 = sVar2 + (cVar1 != *pcVar4);
      local_2c0 = &local_2d8;
      local_2b8 = 3;
      __l._M_len = 3;
      __l._M_array = local_2c0;
      uVar5 = std::min<unsigned_long>(__l);
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,old_diagonal);
      *puVar3 = uVar5;
      y = local_2b0;
      puVar3 = small_vector<unsigned_long,_64UL>::operator[]
                         ((small_vector<unsigned_long,_64UL> *)local_260,old_diagonal);
      puVar3 = std::min<unsigned_long>(&last_diagonal,puVar3);
      last_diagonal = *puVar3;
    }
    if ((max_edit_distance != 0) && (max_edit_distance < last_diagonal)) {
      from_local = (string *)(max_edit_distance + 1);
      goto LAB_0013de0e;
    }
    best_this_column = best_this_column + 1;
  } while( true );
}

Assistant:

std::string::size_type string_distance (std::string const & from, std::string const & to,
                                                std::string::size_type const max_edit_distance) {
            using size_type = std::string::size_type;

            size_type const m = from.size ();
            size_type const n = to.size ();

            small_vector<size_type, 64> column (m + 1U);
            std::iota (std::begin (column), std::end (column), size_type{0});
            constexpr auto column_start = size_type{1};

            for (auto x = column_start; x <= n; x++) {
                column[0] = x;
                auto best_this_column = x;
                auto last_diagonal = x - column_start;
                for (auto y = column_start; y <= m; y++) {
                    auto const old_diagonal = column[y];
                    column[y] = std::min ({column[y] + 1U, column[y - 1U] + 1U,
                                           last_diagonal + (from[y - 1U] == to[x - 1U] ? 0U : 1U)});
                    last_diagonal = old_diagonal;
                    best_this_column = std::min (best_this_column, column[y]);
                }
                if (max_edit_distance != 0 && best_this_column > max_edit_distance) {
                    return max_edit_distance + 1U;
                }
            }
            return column[m];
        }